

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

TermList ApplicativeHelper::getHead(TermList t)

{
  bool bVar1;
  ulong in_RDI;
  TermList local_18;
  
  local_18._content = in_RDI;
  if ((in_RDI & 3) == 0) {
    do {
      bVar1 = Kernel::TermList::isApplication(&local_18);
      if (!bVar1) {
        return (TermList)local_18._content;
      }
      local_18._content =
           *(ulong *)(local_18._content + 0x18 +
                     (ulong)(*(uint *)(local_18._content + 0xc) & 0xfffffff) * 8);
      if ((local_18._content & 3) != 0) {
        return (TermList)local_18._content;
      }
    } while (*(uint *)(local_18._content + 8) < 0xfffffff9);
  }
  return (TermList)local_18._content;
}

Assistant:

TermList ApplicativeHelper::getHead(TermList t)
{
  if(!t.isTerm()){
    return t; 
  }

  while(t.isApplication()){
    t = *t.term()->nthArgument(2);
    if(!t.isTerm() || t.term()->isSpecial()){ break; } 
  }
  return t;
}